

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saslclientio.c
# Opt level: O2

int saslclientio_setoption(CONCRETE_IO_HANDLE sasl_client_io,char *option_name,void *value)

{
  XIO_HANDLE xio;
  int iVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  char *pcVar4;
  SASL_CLIENT_IO_INSTANCE *sasl_client_io_instance;
  
  if (sasl_client_io == (CONCRETE_IO_HANDLE)0x0 || option_name == (char *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x4d2;
    }
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/saslclientio.c"
              ,"saslclientio_setoption",0x4d1,1,
              "Bad arguments: sasl_client_io = %p, option_name = %p",sasl_client_io,option_name);
    return 0x4d2;
  }
  xio = *sasl_client_io;
  if (xio == (XIO_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x4db;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x4db;
    }
    pcVar4 = "NULL underlying_io";
    iVar3 = 0x4da;
LAB_001194e9:
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/saslclientio.c"
              ,"saslclientio_setoption",iVar3,1,pcVar4);
  }
  else {
    iVar1 = strcmp("logtrace",option_name);
    if (iVar1 == 0) {
      *(byte *)((long)sasl_client_io + 0x78) =
           *(byte *)((long)sasl_client_io + 0x78) & 0xfc | *value | 2;
    }
    else {
      iVar1 = xio_setoption(xio,option_name,value);
      if (iVar1 != 0) {
        p_Var2 = xlogging_get_log_function();
        iVar1 = 0x4ed;
        if (p_Var2 == (LOGGER_LOG)0x0) {
          return 0x4ed;
        }
        pcVar4 = "Error executing xio_setoption";
        iVar3 = 0x4ec;
        goto LAB_001194e9;
      }
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int saslclientio_setoption(CONCRETE_IO_HANDLE sasl_client_io, const char* option_name, const void* value)
{
    int result;

    if ((sasl_client_io == NULL) ||
        (option_name == NULL))
    {
        /* Codes_SRS_SASLCLIENTIO_01_130: [ If `sasl_client_io` or `option_name` is NULL, `saslclientio_setoption`  shall fail and return a non-zero value. ]*/
        LogError("Bad arguments: sasl_client_io = %p, option_name = %p",
            sasl_client_io, option_name);
        result = MU_FAILURE;
    }
    else
    {
        SASL_CLIENT_IO_INSTANCE* sasl_client_io_instance = (SASL_CLIENT_IO_INSTANCE*)sasl_client_io;

        if (sasl_client_io_instance->underlying_io == NULL)
        {
            LogError("NULL underlying_io");
            result = MU_FAILURE;
        }
        /* Codes_SRS_SASLCLIENTIO_01_131: [ SASL client IO shall handle the following options: ]*/
        /* Codes_SRS_SASLCLIENTIO_01_132: [ - logtrace - bool. ]*/
        else if (strcmp("logtrace", option_name) == 0)
        {
            sasl_client_io_instance->is_trace_on = *((bool*)value) == true ? 1 : 0;
            sasl_client_io_instance->is_trace_on_set = 1;

            /* Codes_SRS_SASLCLIENTIO_01_128: [ On success, `saslclientio_setoption` shall return 0. ]*/
            result = 0;
        }
        else
        {
            /* Codes_SRS_SASLCLIENTIO_03_001: [`saslclientio_setoption` shall forward all unhandled options to underlying io by calling `xio_setoption`.]*/
            if (xio_setoption(sasl_client_io_instance->underlying_io, option_name, value) != 0)
            {
                LogError("Error executing xio_setoption");
                result = MU_FAILURE;
            }
            else
            {
                /* Codes_SRS_SASLCLIENTIO_01_128: [ On success, `saslclientio_setoption` shall return 0. ]*/
                result = 0;
            }
        }
    }

    return result;
}